

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerSetPagesize(Pager *pPager,u32 *pPageSize,int nReserve)

{
  long lVar1;
  i64 iVar2;
  int in_EDX;
  uint *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char *pNew;
  u32 pageSize;
  int rc;
  i64 nByte;
  i64 *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  void *local_38;
  uint szPage;
  int iVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  szPage = *in_RSI;
  if ((((*(char *)(in_RDI + 0x13) == '\0') || (*(int *)(in_RDI + 0x20) == 0)) &&
      (iVar2 = sqlite3PcacheRefCount(*(PCache **)(in_RDI + 0x120)), iVar2 == 0)) &&
     ((szPage != 0 && (szPage != (uint)*(undefined8 *)(in_RDI + 200))))) {
    local_38 = (void *)0x0;
    if ((*(char *)(in_RDI + 0x15) != '\0') && (**(long **)(in_RDI + 0x48) != 0)) {
      iVar3 = sqlite3OsFileSize((sqlite3_file *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_stack_ffffffffffffffb8);
    }
    if (iVar3 == 0) {
      local_38 = sqlite3PageMalloc(0);
      if (local_38 == (void *)0x0) {
        iVar3 = 7;
      }
      else {
        memset((void *)((long)local_38 + (ulong)szPage),0,8);
      }
    }
    if (iVar3 == 0) {
      pager_reset((Pager *)0x15a799);
      iVar3 = sqlite3PcacheSetPageSize((PCache *)CONCAT44(in_EDX,iVar3),szPage);
    }
    if (iVar3 == 0) {
      sqlite3PageFree((void *)0x15a7ca);
      *(void **)(in_RDI + 0x118) = local_38;
      *(int *)(in_RDI + 0x20) = (int)((long)((ulong)szPage - 1) / (long)(ulong)szPage);
      *(ulong *)(in_RDI + 200) = (ulong)szPage;
      *(uint *)(in_RDI + 0xc0) = (uint)sqlite3PendingByte / szPage + 1;
    }
    else {
      sqlite3PageFree((void *)0x15a838);
    }
  }
  *in_RSI = (uint)*(undefined8 *)(in_RDI + 200);
  if (iVar3 == 0) {
    if (in_EDX < 0) {
      in_EDX = (int)*(short *)(in_RDI + 0xb2);
    }
    *(short *)(in_RDI + 0xb2) = (short)in_EDX;
    pagerFixMaplimit((Pager *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSetPagesize(Pager *pPager, u32 *pPageSize, int nReserve){
  int rc = SQLITE_OK;

  /* It is not possible to do a full assert_pager_state() here, as this
  ** function may be called from within PagerOpen(), before the state
  ** of the Pager object is internally consistent.
  **
  ** At one point this function returned an error if the pager was in
  ** PAGER_ERROR state. But since PAGER_ERROR state guarantees that
  ** there is at least one outstanding page reference, this function
  ** is a no-op for that case anyhow.
  */

  u32 pageSize = *pPageSize;
  assert( pageSize==0 || (pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE) );
  if( (pPager->memDb==0 || pPager->dbSize==0)
   && sqlite3PcacheRefCount(pPager->pPCache)==0
   && pageSize && pageSize!=(u32)pPager->pageSize
  ){
    char *pNew = NULL;             /* New temp space */
    i64 nByte = 0;

    if( pPager->eState>PAGER_OPEN && isOpen(pPager->fd) ){
      rc = sqlite3OsFileSize(pPager->fd, &nByte);
    }
    if( rc==SQLITE_OK ){
      /* 8 bytes of zeroed overrun space is sufficient so that the b-tree
      * cell header parser will never run off the end of the allocation */
      pNew = (char *)sqlite3PageMalloc(pageSize+8);
      if( !pNew ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        memset(pNew+pageSize, 0, 8);
      }
    }

    if( rc==SQLITE_OK ){
      pager_reset(pPager);
      rc = sqlite3PcacheSetPageSize(pPager->pPCache, pageSize);
    }
    if( rc==SQLITE_OK ){
      sqlite3PageFree(pPager->pTmpSpace);
      pPager->pTmpSpace = pNew;
      pPager->dbSize = (Pgno)((nByte+pageSize-1)/pageSize);
      pPager->pageSize = pageSize;
      pPager->lckPgno = (Pgno)(PENDING_BYTE/pageSize) + 1;
    }else{
      sqlite3PageFree(pNew);
    }
  }

  *pPageSize = pPager->pageSize;
  if( rc==SQLITE_OK ){
    if( nReserve<0 ) nReserve = pPager->nReserve;
    assert( nReserve>=0 && nReserve<1000 );
    pPager->nReserve = (i16)nReserve;
    pagerFixMaplimit(pPager);
  }
  return rc;
}